

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::MaterialBinding::MaterialBinding(MaterialBinding *this,MaterialBinding *param_1)

{
  bool bVar1;
  
  bVar1 = (param_1->materialBinding).has_value_;
  (this->materialBinding).has_value_ = bVar1;
  if (bVar1 == true) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::Relationship>::construct_value
              ((storage_t<tinyusdz::Relationship> *)&(this->materialBinding).contained,
               (value_type *)&(param_1->materialBinding).contained);
  }
  bVar1 = (param_1->materialBindingPreview).has_value_;
  (this->materialBindingPreview).has_value_ = bVar1;
  if (bVar1 == true) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::Relationship>::construct_value
              ((storage_t<tinyusdz::Relationship> *)&(this->materialBindingPreview).contained,
               (value_type *)&(param_1->materialBindingPreview).contained);
  }
  bVar1 = (param_1->materialBindingFull).has_value_;
  (this->materialBindingFull).has_value_ = bVar1;
  if (bVar1 == true) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::Relationship>::construct_value
              ((storage_t<tinyusdz::Relationship> *)&(this->materialBindingFull).contained,
               (value_type *)&(param_1->materialBindingFull).contained);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  ::_Rb_tree(&(this->_materialBindingMap)._M_t,&(param_1->_materialBindingMap)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  ::_Rb_tree(&(this->_materialBindingCollectionMap)._M_t,
             &(param_1->_materialBindingCollectionMap)._M_t);
  return;
}

Assistant:

static value::token kAllPurpose() {
    return value::token("");
  }